

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_edge_split
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  REF_INT local_118;
  int local_114;
  int local_10c;
  int local_108;
  int local_100;
  REF_INT local_fc;
  int local_f8;
  REF_INT local_f4;
  int local_f0;
  int local_e8;
  int local_e4;
  int local_dc;
  REF_INT local_d8;
  int local_d4;
  REF_INT local_d0;
  REF_INT local_c8;
  int local_c4;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT n1;
  REF_INT n0;
  REF_INT cell_edge;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_BOOL has_node1;
  REF_BOOL has_node0;
  REF_BOOL has_triangle;
  REF_INT cell_face;
  REF_INT face_node;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  int local_28;
  REF_INT new_node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_node._4_4_ = new_node;
  local_28 = node1;
  new_node_local = node0;
  _node1_local = ref_grid;
  ref_grid_local = (REF_GRID)ref_cavity;
  uVar3 = ref_cavity_form_empty(ref_cavity,ref_grid,new_node);
  if (uVar3 == 0) {
    if (((*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
          *(int *)(*(long *)&ref_cell->n + (long)new_node_local * 4)) &&
        (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
         *(int *)(*(long *)&ref_cell->n + (long)local_28 * 4))) &&
       (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
        *(int *)(*(long *)&ref_cell->n + (long)ref_node._4_4_ * 4))) {
      if ((_node1_local->cell[9]->n < 1) && (_node1_local->cell[10]->n < 1)) {
        *(REF_INT *)(ref_grid_local->cell + 10) = new_node_local;
        *(int *)((long)ref_grid_local->cell + 0x54) = local_28;
        _cell_node = _node1_local->cell[8];
        if ((new_node_local < 0) || (_cell_node->ref_adj->nnode <= new_node_local)) {
          local_c4 = -1;
        }
        else {
          local_c4 = _cell_node->ref_adj->first[new_node_local];
        }
        cell = local_c4;
        if (local_c4 == -1) {
          local_c8 = -1;
        }
        else {
          local_c8 = _cell_node->ref_adj->item[local_c4].ref;
        }
        cell_face = local_c8;
        while (cell != -1) {
          for (face_node = 0; face_node < _cell_node->node_per; face_node = face_node + 1) {
            if (local_28 == _cell_node->c2n[face_node + _cell_node->size_per * cell_face]) {
              uVar3 = ref_list_contains((REF_LIST)ref_grid_local->cell[8],cell_face,face_nodes + 2);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x589,"ref_cavity_form_edge_split",(ulong)uVar3,"have tet?");
                return uVar3;
              }
              if (face_nodes[2] != 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x58a,"ref_cavity_form_edge_split","added tet twice?");
                return 1;
              }
              uVar3 = ref_list_push((REF_LIST)ref_grid_local->cell[8],cell_face);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x58b,"ref_cavity_form_edge_split",(ulong)uVar3,"save tet");
                return uVar3;
              }
              uVar3 = ref_cell_all_local(_cell_node,(REF_NODE)ref_cell,cell_face,face_nodes + 1);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x58c,"ref_cavity_form_edge_split",(ulong)uVar3,"local cell");
                return uVar3;
              }
              if (face_nodes[1] == 0) {
                *(undefined4 *)&ref_grid_local->mpi = 3;
                return 0;
              }
              for (has_node0 = 0; has_node0 < _cell_node->face_per; has_node0 = has_node0 + 1) {
                for (has_triangle = 0; has_triangle < 3; has_triangle = has_triangle + 1) {
                  seg_nodes[(long)has_triangle + 1] =
                       _cell_node->c2n
                       [_cell_node->f2n[has_triangle + has_node0 * 4] +
                        _cell_node->size_per * cell_face];
                }
                bVar4 = true;
                if ((new_node_local != seg_nodes[1]) &&
                   (bVar4 = true, new_node_local != seg_nodes[2])) {
                  bVar4 = new_node_local == face_nodes[0];
                }
                bVar5 = true;
                if ((local_28 != seg_nodes[1]) && (bVar5 = true, local_28 != seg_nodes[2])) {
                  bVar5 = local_28 == face_nodes[0];
                }
                if (((!bVar4) || (!bVar5)) &&
                   (uVar3 = ref_cavity_insert_face((REF_CAVITY)ref_grid_local,seg_nodes + 1),
                   uVar3 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x59b,"ref_cavity_form_edge_split",(ulong)uVar3,"tet side");
                  return uVar3;
                }
              }
            }
          }
          cell = _cell_node->ref_adj->item[cell].next;
          if (cell == -1) {
            local_d0 = -1;
          }
          else {
            local_d0 = _cell_node->ref_adj->item[cell].ref;
          }
          cell_face = local_d0;
        }
        _cell_node = _node1_local->cell[3];
        uVar3 = ref_cell_has_side(_cell_node,new_node_local,local_28,&has_node1);
        if (uVar3 == 0) {
          if (has_node1 != 0) {
            if ((new_node_local < 0) || (_cell_node->ref_adj->nnode <= new_node_local)) {
              local_d4 = -1;
            }
            else {
              local_d4 = _cell_node->ref_adj->first[new_node_local];
            }
            cell = local_d4;
            if (local_d4 == -1) {
              local_d8 = -1;
            }
            else {
              local_d8 = _cell_node->ref_adj->item[local_d4].ref;
            }
            cell_face = local_d8;
            while (cell != -1) {
              for (face_node = 0; face_node < _cell_node->node_per; face_node = face_node + 1) {
                if (local_28 == _cell_node->c2n[face_node + _cell_node->size_per * cell_face]) {
                  uVar3 = ref_list_push((REF_LIST)ref_grid_local->cell[7],cell_face);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x5a5,"ref_cavity_form_edge_split",(ulong)uVar3,"save tri");
                    return uVar3;
                  }
                  uVar3 = ref_cell_all_local(_cell_node,(REF_NODE)ref_cell,cell_face,face_nodes + 1)
                  ;
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x5a7,"ref_cavity_form_edge_split",(ulong)uVar3,"local cell");
                    return uVar3;
                  }
                  if (face_nodes[1] == 0) {
                    *(undefined4 *)&ref_grid_local->mpi = 3;
                    return 0;
                  }
                  for (n1 = 0; n1 < _cell_node->edge_per; n1 = n1 + 1) {
                    iVar1 = _cell_node->c2n
                            [_cell_node->e2n[n1 << 1] + _cell_node->size_per * cell_face];
                    iVar2 = _cell_node->c2n
                            [_cell_node->e2n[n1 * 2 + 1] + _cell_node->size_per * cell_face];
                    if (new_node_local < local_28) {
                      local_dc = new_node_local;
                    }
                    else {
                      local_dc = local_28;
                    }
                    local_e4 = iVar2;
                    if (iVar1 < iVar2) {
                      local_e4 = iVar1;
                    }
                    if (local_dc == local_e4) {
                      if (local_28 < new_node_local) {
                        local_e8 = new_node_local;
                      }
                      else {
                        local_e8 = local_28;
                      }
                      local_f0 = iVar2;
                      if (iVar2 < iVar1) {
                        local_f0 = iVar1;
                      }
                      if (local_e8 != local_f0) goto LAB_00251fa6;
                    }
                    else {
LAB_00251fa6:
                      seg_nodes[0] = _cell_node->c2n[_cell_node->size_per * cell_face + 3];
                      n0 = iVar1;
                      cell_edge = iVar2;
                      uVar3 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&n0);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x5b6,"ref_cavity_form_edge_split",(ulong)uVar3,"tri side");
                        return uVar3;
                      }
                    }
                  }
                }
              }
              cell = _cell_node->ref_adj->item[cell].next;
              if (cell == -1) {
                local_f4 = -1;
              }
              else {
                local_f4 = _cell_node->ref_adj->item[cell].ref;
              }
              cell_face = local_f4;
            }
            if ((ref_grid_local->cell[7]->type != REF_CELL_ED2) &&
               (ref_grid_local->cell[7]->type != REF_CELL_ED3)) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x5bc,"ref_cavity_form_edge_split","expect one or two tri");
              return 1;
            }
            if (ref_grid_local->cell[7]->type == REF_CELL_ED2) {
              if ((new_node_local < 0) || (_cell_node->ref_adj->nnode <= new_node_local)) {
                local_f8 = -1;
              }
              else {
                local_f8 = _cell_node->ref_adj->first[new_node_local];
              }
              cell = local_f8;
              if (local_f8 == -1) {
                local_fc = -1;
              }
              else {
                local_fc = _cell_node->ref_adj->item[local_f8].ref;
              }
              cell_face = local_fc;
              while (cell != -1) {
                for (face_node = 0; face_node < _cell_node->node_per; face_node = face_node + 1) {
                  if (local_28 == _cell_node->c2n[face_node + _cell_node->size_per * cell_face]) {
                    for (n1 = 0; n1 < _cell_node->edge_per; n1 = n1 + 1) {
                      iVar1 = _cell_node->c2n
                              [_cell_node->e2n[n1 << 1] + _cell_node->size_per * cell_face];
                      iVar2 = _cell_node->c2n
                              [_cell_node->e2n[n1 * 2 + 1] + _cell_node->size_per * cell_face];
                      if (new_node_local < local_28) {
                        local_100 = new_node_local;
                      }
                      else {
                        local_100 = local_28;
                      }
                      local_108 = iVar2;
                      if (iVar1 < iVar2) {
                        local_108 = iVar1;
                      }
                      if (local_100 == local_108) {
                        if (local_28 < new_node_local) {
                          local_10c = new_node_local;
                        }
                        else {
                          local_10c = local_28;
                        }
                        local_114 = iVar2;
                        if (iVar2 < iVar1) {
                          local_114 = iVar1;
                        }
                        if (local_10c == local_114) {
                          cell_edge = ref_node._4_4_;
                          seg_nodes[0] = _cell_node->c2n[_cell_node->size_per * cell_face + 3];
                          n0 = iVar1;
                          uVar3 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&n0);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x5c9,"ref_cavity_form_edge_split",(ulong)uVar3,"tri side");
                            return uVar3;
                          }
                          n0 = ref_node._4_4_;
                          seg_nodes[0] = _cell_node->c2n[_cell_node->size_per * cell_face + 3];
                          cell_edge = iVar2;
                          uVar3 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&n0);
                          if (uVar3 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                                   ,0x5cd,"ref_cavity_form_edge_split",(ulong)uVar3,"tri side");
                            return uVar3;
                          }
                        }
                      }
                    }
                  }
                }
                cell = _cell_node->ref_adj->item[cell].next;
                if (cell == -1) {
                  local_118 = -1;
                }
                else {
                  local_118 = _cell_node->ref_adj->item[cell].ref;
                }
                cell_face = local_118;
              }
            }
          }
          uVar3 = ref_cavity_verify_face_manifold((REF_CAVITY)ref_grid_local);
          if (uVar3 == 0) {
            ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold((REF_CAVITY)ref_grid_local);
            if (ref_cavity_local._4_4_ == 0) {
              ref_cavity_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x5d5,"ref_cavity_form_edge_split",(ulong)ref_cavity_local._4_4_,
                     "split seg manifold");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x5d4,"ref_cavity_form_edge_split",(ulong)uVar3,"split face manifold");
            ref_cavity_local._4_4_ = uVar3;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x5a2,"ref_cavity_form_edge_split",(ulong)uVar3,"triangle side");
          ref_cavity_local._4_4_ = uVar3;
        }
      }
      else {
        *(undefined4 *)&ref_grid_local->mpi = 4;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      *(undefined4 *)&ref_grid_local->mpi = 3;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x574,
           "ref_cavity_form_edge_split",(ulong)uVar3,"init form empty");
    ref_cavity_local._4_4_ = uVar3;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_split(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  REF_INT cell_edge, n0, n1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, new_node), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, new_node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->split_node0 = node0;
  ref_cavity->split_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        if (MIN(node0, node1) == MIN(n0, n1) &&
            MAX(node0, node1) == MAX(n0, n1)) {
          /* skip the edge to be split */
        } else {
          seg_nodes[0] = n0;
          seg_nodes[1] = n1;
          seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
          RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
        }
      }
    }
    RAS(1 == ref_list_n(ref_cavity_tri_list(ref_cavity)) ||
            2 == ref_list_n(ref_cavity_tri_list(ref_cavity)),
        "expect one or two tri");
    if (1 == ref_list_n(ref_cavity_tri_list(ref_cavity))) {
      each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node,
                                 cell) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          if (MIN(node0, node1) == MIN(n0, n1) &&
              MAX(node0, node1) == MAX(n0, n1)) {
            /* close topo with explicit edge split */
            seg_nodes[0] = n0;
            seg_nodes[1] = new_node;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
            seg_nodes[0] = new_node;
            seg_nodes[1] = n1;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
          }
        }
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "split face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "split seg manifold");

  return REF_SUCCESS;
}